

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_schnorrsig.cpp
# Opt level: O1

void __thiscall SchnorrSig_Sign_Test::TestBody(SchnorrSig_Sign_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  SchnorrSignature sig;
  string local_b0;
  internal local_90 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  string local_80;
  ByteData local_60;
  ByteData local_48;
  SchnorrSignature local_30;
  
  cfd::core::SchnorrUtil::Sign(&local_30,&::msg,&::sk,&aux_rand);
  cfd::core::SchnorrSignature::GetData(&local_48,&::signature,false);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_b0,&local_48);
  cfd::core::SchnorrSignature::GetData(&local_60,&local_30,false);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_80,&local_60);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_90,"signature.GetData().GetHex()","sig.GetData().GetHex()",&local_b0,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_90[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_88.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_88.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x26,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if ((long *)local_b0._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_b0._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_b0._M_dataplus._M_p + 8))();
      }
      local_b0._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_30.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(SchnorrSig, Sign) {
  auto sig = SchnorrUtil::Sign(msg, sk, aux_rand);

  EXPECT_EQ(signature.GetData().GetHex(), sig.GetData().GetHex());
}